

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypesHierarchy.cpp
# Opt level: O1

set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> * __thiscall
TypesHierarchy::GetCompositesForTypes
          (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
           *__return_storage_ptr__,TypesHierarchy *this,TYPE_ID type)

{
  _Rb_tree_header *p_Var1;
  pointer pvVar2;
  ulong uVar3;
  ulong uVar4;
  TYPE_ID *pTVar5;
  undefined1 local_68 [8];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> tmp;
  TYPE_ID type_local;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  tmp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tmp;
  tmp._M_t._M_impl._0_4_ = 0;
  tmp._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tmp._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tmp._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  uVar4 = (ulong)this->CompositeStartFrom;
  pvVar2 = (this->types).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->types).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
          -0x5555555555555555;
  tmp._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tmp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  tmp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = type;
  if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
    do {
      pTVar5 = pvVar2[uVar4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (pTVar5 != *(pointer *)
                     ((long)&(this->types).
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar4].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data + 8)) {
        do {
          if (*pTVar5 == tmp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_) {
            tmp._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = (undefined4)uVar4;
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::_M_insert_unique<unsigned_int>
                      (&__return_storage_ptr__->_M_t,
                       (uint *)&tmp._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          pTVar5 = pTVar5 + 1;
        } while (pTVar5 != *(pointer *)
                            ((long)&(this->types).
                                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data + 8));
      }
      uVar4 = uVar4 + 1;
      pvVar2 = (this->types).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)(((long)(this->types).
                                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3)
                            * -0x5555555555555555));
  }
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)__return_storage_ptr__,
             (uint *)((long)&tmp._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)local_68);
  return __return_storage_ptr__;
}

Assistant:

set<TYPE_ID> TypesHierarchy::GetCompositesForTypes(TYPE_ID type) {
	vector<TYPE_ID>::iterator it2;
	set<TYPE_ID> vect;
	set<TYPE_ID> tmp;

	for (size_t i = CompositeStartFrom; i < types.size(); i++) {
		for (it2 = types[i].begin(); it2 != types[i].end(); it2++) {
			if (*it2 == type) {
//				cerr << i << endl;
//				tmp = GetGenericTypes(*it2);
//				vect.insert( tmp.begin(), tmp.end() );
				vect.insert(i);
			}
		}
	}
	vect.insert(type);
	return vect;
}